

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist_test.cpp
# Opt level: O3

pint p_test_case_plist_general_test(void)

{
  undefined8 uVar1;
  int *piVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  TestData test_data;
  undefined8 local_28;
  undefined8 uStack_20;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  uVar1 = p_list_append(0,0x20);
  piVar2 = (int *)p_list_append(uVar1,0x40);
  if (piVar2 == (int *)0x0) {
    uVar1 = 0x76;
  }
  else {
    lVar3 = p_list_length(piVar2);
    if (lVar3 != 2) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
             ,0x77);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    if (*piVar2 != 0x20) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
             ,0x7a);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    piVar4 = (int *)p_list_last(piVar2);
    if (*piVar4 != 0x40) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
             ,0x7b);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    piVar2 = (int *)p_list_prepend(piVar2,0x80);
    if (piVar2 == (int *)0x0) {
      uVar1 = 0x7f;
    }
    else {
      lVar3 = p_list_length(piVar2);
      if (lVar3 != 3) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x80);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if (*piVar2 != 0x80) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x81);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      piVar4 = (int *)p_list_last(piVar2);
      if (*piVar4 != 0x40) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x82);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      local_28 = 0;
      uStack_20 = 0;
      p_list_foreach(piVar2,foreach_test_func,&local_28);
      if (uStack_20._4_4_ != 3) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x8e);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if ((int)local_28 != 0x80) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x8f);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if (local_28._4_4_ != 0x20) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x90);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if ((int)uStack_20 != 0x40) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x91);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      piVar2 = (int *)p_list_reverse(piVar2);
      if (piVar2 == (int *)0x0) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x97);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      lVar3 = p_list_length(piVar2);
      if (lVar3 != 3) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x98);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if (*piVar2 != 0x40) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x99);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      piVar4 = (int *)p_list_last(piVar2);
      if (*piVar4 != 0x80) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0x9a);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      local_28 = 0;
      uStack_20 = 0;
      p_list_foreach(piVar2,foreach_test_func,&local_28);
      if (uStack_20._4_4_ != 3) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0xa6);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if ((int)local_28 != 0x40) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0xa7);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if (local_28._4_4_ != 0x20) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0xa8);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if ((int)uStack_20 != 0x80) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
               ,0xa9);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      lVar3 = p_list_remove(piVar2,0x20);
      if (lVar3 == 0) {
        uVar1 = 0xad;
      }
      else {
        lVar5 = p_list_length(lVar3);
        if (lVar5 != 2) {
          printf("%s:%d: check failed\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
                 ,0xae);
          p_atomic_int_inc(&p_test_module_fail_counter);
        }
        lVar3 = p_list_remove(lVar3,0x80);
        if (lVar3 == 0) {
          uVar1 = 0xb1;
        }
        else {
          lVar5 = p_list_length(lVar3);
          if (lVar5 != 1) {
            printf("%s:%d: check failed\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
                   ,0xb2);
            p_atomic_int_inc(&p_test_module_fail_counter);
          }
          lVar3 = p_list_remove(lVar3,0x100);
          if (lVar3 == 0) {
            uVar1 = 0xb5;
          }
          else {
            lVar5 = p_list_length(lVar3);
            if (lVar5 != 1) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
                     ,0xb6);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            lVar3 = p_list_remove(lVar3,0x40);
            if (lVar3 == 0) {
              lVar3 = p_list_length(0);
              if (lVar3 != 0) {
                printf("%s:%d: check failed\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
                       ,0xba);
                p_atomic_int_inc(&p_test_module_fail_counter);
              }
              p_list_free(0);
              p_libsys_shutdown();
              return -(uint)(p_test_module_fail_counter != 0);
            }
            uVar1 = 0xb9;
          }
        }
      }
    }
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
         ,uVar1);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (plist_general_test)
{
	PList		*list = NULL;
	TestData	test_data;

	p_libsys_init ();

	/* Testing append */
	list = p_list_append (list, P_INT_TO_POINTER (32));
	list = p_list_append (list, P_INT_TO_POINTER (64));

	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 2);

	/* Testing data access */
	P_TEST_CHECK (P_POINTER_TO_INT (list->data) == 32);
	P_TEST_CHECK (P_POINTER_TO_INT (p_list_last(list)->data) == 64);

	/* Testing prepend */
	list = p_list_prepend (list, P_INT_TO_POINTER (128));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 3);
	P_TEST_CHECK (P_POINTER_TO_INT (list->data) == 128);
	P_TEST_CHECK (P_POINTER_TO_INT (p_list_last(list)->data) == 64);

	/* Testing for each loop */
	memset (&test_data, 0, sizeof (test_data));

	P_TEST_REQUIRE (test_data.test_array[0] == 0);
	P_TEST_REQUIRE (test_data.test_array[1] == 0);
	P_TEST_REQUIRE (test_data.test_array[2] == 0);
	P_TEST_REQUIRE (test_data.index == 0);

	p_list_foreach (list, (PFunc) foreach_test_func, (ppointer) &test_data);

	P_TEST_CHECK (test_data.index == 3);
	P_TEST_CHECK (test_data.test_array[0] == 128);
	P_TEST_CHECK (test_data.test_array[1] == 32);
	P_TEST_CHECK (test_data.test_array[2] == 64);

	/* Testing reverse */

	list = p_list_reverse (list);

	P_TEST_CHECK (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 3);
	P_TEST_CHECK (P_POINTER_TO_INT (list->data) == 64);
	P_TEST_CHECK (P_POINTER_TO_INT (p_list_last(list)->data) == 128);

	/* Testing for each loop */
	memset (&test_data, 0, sizeof (test_data));

	P_TEST_REQUIRE (test_data.test_array[0] == 0);
	P_TEST_REQUIRE (test_data.test_array[1] == 0);
	P_TEST_REQUIRE (test_data.test_array[2] == 0);
	P_TEST_REQUIRE (test_data.index == 0);

	p_list_foreach (list, (PFunc) foreach_test_func, (ppointer) &test_data);

	P_TEST_CHECK (test_data.index == 3);
	P_TEST_CHECK (test_data.test_array[0] == 64);
	P_TEST_CHECK (test_data.test_array[1] == 32);
	P_TEST_CHECK (test_data.test_array[2] == 128);

	/* Testing remove */
	list = p_list_remove (list, P_INT_TO_POINTER (32));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 2);

	list = p_list_remove (list, P_INT_TO_POINTER (128));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 1);

	list = p_list_remove (list, P_INT_TO_POINTER (256));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 1);

	list = p_list_remove (list, P_INT_TO_POINTER (64));
	P_TEST_REQUIRE (list == NULL);
	P_TEST_CHECK (p_list_length (list) == 0);

	p_list_free (list);

	p_libsys_shutdown ();
}